

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O2

void __thiscall chrono::ChSystem::AddBody(ChSystem *this,shared_ptr<chrono::ChBody> *body)

{
  int iVar1;
  int iVar2;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             &(((body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              collision_model).
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>);
  iVar1 = (*(local_30._M_ptr)->_vptr_ChCollisionModel[2])();
  iVar2 = (*((this->collision_system).
             super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChCollisionSystem[2])();
  if (iVar1 == iVar2) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    ((body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->body_id =
         (uint)((ulong)((long)(this->assembly).bodylist.
                              super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->assembly).bodylist.
                             super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
    std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
    ChAssembly::AddBody(&this->assembly,(shared_ptr<chrono::ChBody> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    return;
  }
  __assert_fail("body->GetCollisionModel()->GetType() == collision_system->GetType()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChSystem.cpp"
                ,0x9f,"virtual void chrono::ChSystem::AddBody(std::shared_ptr<ChBody>)");
}

Assistant:

void ChSystem::AddBody(std::shared_ptr<ChBody> body) {
    assert(body->GetCollisionModel()->GetType() == collision_system->GetType());
    body->SetId(static_cast<int>(Get_bodylist().size()));
    assembly.AddBody(body);
}